

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O2

int If_ManNodeShapeMap2_rec(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited,Vec_Int_t *vShape)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  If_Obj_t *pIVar4;
  float fVar5;
  If_Obj_t *local_48;
  
  fVar5 = (pIfObj->CutBest).Area;
  if (fVar5 == 0.0) {
    Vec_PtrPush(vVisited,&pIfObj->CutBest);
    (pIfObj->CutBest).Area = -NAN;
    if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) == (undefined1  [112])0x2) {
      fVar5 = -NAN;
    }
    else {
      local_48 = (If_Obj_t *)0x0;
      fVar5 = 0.0;
      for (pIVar4 = pIfObj; pIVar4 != (If_Obj_t *)0x0; pIVar4 = pIVar4->pEquiv) {
        uVar1 = If_ManNodeShapeMap2_rec(pIfMan,pIVar4->pFanin0,vVisited,vShape);
        if (uVar1 != 0xffffffff) {
          uVar2 = If_ManNodeShapeMap2_rec(pIfMan,pIVar4->pFanin1,vVisited,vShape);
          if (uVar2 != 0xffffffff) {
            fVar3 = (float)(uVar2 | uVar1);
            if ((int)fVar5 < (int)fVar3) {
              local_48 = pIVar4;
            }
            if ((int)fVar5 <= (int)fVar3) {
              fVar5 = fVar3;
            }
          }
        }
      }
      if (local_48 == (If_Obj_t *)0x0) {
        fVar5 = (pIfObj->CutBest).Area;
      }
      else {
        Vec_IntPush(vShape,pIfObj->Id);
        Vec_IntPush(vShape,local_48->Id);
        (pIfObj->CutBest).Area = fVar5;
      }
    }
  }
  return (int)fVar5;
}

Assistant:

int If_ManNodeShapeMap2_rec( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited, Vec_Int_t * vShape )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp, * pTempBest = NULL;
    int i, iFunc, iFunc0, iFunc1, iBest = 0;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutDataInt(pCut) )
        return If_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return If_CutDataInt(pCut);
    // compute the functions of the children
    for ( i = 0, pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv, i++ )
    {
        iFunc0 = If_ManNodeShapeMap2_rec( pIfMan, pTemp->pFanin0, vVisited, vShape );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = If_ManNodeShapeMap2_rec( pIfMan, pTemp->pFanin1, vVisited, vShape );
        if ( iFunc1 == ~0 )
            continue;
        iFunc = iFunc0 | iFunc1;
//        if ( If_WordCountOnes(iBest) <= If_WordCountOnes(iFunc) )
        if ( iBest < iFunc )
        {
            iBest = iFunc;
            pTempBest = pTemp;
        }
    }
    if ( pTempBest )
    {
        Vec_IntPush( vShape, pIfObj->Id );
        Vec_IntPush( vShape, pTempBest->Id );
        If_CutSetDataInt( pCut, iBest );
    }
    return If_CutDataInt(pCut);
}